

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

iterator * __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator++(iterator *this)

{
  iterator *this_local;
  
  if (this->inner_ != (Inner *)0x0) {
    raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++(&this->it_);
    skip_empty(this);
    return this;
  }
  __assert_fail("inner_",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0xa95,
                "iterator &phmap::priv::parallel_hash_set<4, phmap::priv::raw_hash_set, phmap::NullMutex, phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>>::iterator::operator++() [N = 4, RefSet = phmap::priv::raw_hash_set, Mtx_ = phmap::NullMutex, Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum, std::basic_string<char>>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::Enum, std::basic_string<char>>>]"
               );
}

Assistant:

iterator& operator++() {
            assert(inner_); // null inner means we are already at the end
            ++it_;
            skip_empty();
            return *this;
        }